

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtentBuilder.h
# Opt level: O1

Extent<double> * Parfait::ExtentBuilder::intersection<double>(Extent<double> *e1,Extent<double> *e2)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  int i;
  long lVar4;
  Extent<double> *in_RDI;
  ulong uVar5;
  double dVar6;
  
  dVar6 = (e1->lo).pos._M_elems[0];
  if ((dVar6 < (e2->hi).pos._M_elems[0] || dVar6 == (e2->hi).pos._M_elems[0]) &&
     (dVar6 = (e2->lo).pos._M_elems[0],
     dVar6 < (e1->hi).pos._M_elems[0] || dVar6 == (e1->hi).pos._M_elems[0])) {
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if ((uVar5 == 2) ||
         (dVar6 = (e1->lo).pos._M_elems[uVar5 + 1], pdVar1 = (e2->hi).pos._M_elems + uVar5 + 1,
         *pdVar1 <= dVar6 && dVar6 != *pdVar1)) break;
      dVar6 = (e2->lo).pos._M_elems[uVar5 + 1];
      pdVar1 = (e1->hi).pos._M_elems + uVar5 + 1;
      uVar3 = uVar5 + 1;
    } while (dVar6 < *pdVar1 || dVar6 == *pdVar1);
    if (1 < uVar5) {
      lVar4 = 0;
      do {
        dVar6 = (e2->lo).pos._M_elems[lVar4];
        dVar2 = (e1->lo).pos._M_elems[lVar4];
        if (dVar6 <= dVar2) {
          dVar6 = dVar2;
        }
        (in_RDI->lo).pos._M_elems[lVar4] = dVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        dVar6 = (e2->hi).pos._M_elems[lVar4];
        dVar2 = (e1->hi).pos._M_elems[lVar4];
        if (dVar2 <= dVar6) {
          dVar6 = dVar2;
        }
        (in_RDI->hi).pos._M_elems[lVar4] = dVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      return in_RDI;
    }
  }
  (in_RDI->lo).pos._M_elems[0] = 1.79769313486232e+308;
  (in_RDI->lo).pos._M_elems[1] = 1.79769313486232e+308;
  (in_RDI->lo).pos._M_elems[2] = 1.79769313486232e+308;
  (in_RDI->hi).pos._M_elems[0] = -1.79769313486232e+308;
  (in_RDI->hi).pos._M_elems[1] = -1.79769313486232e+308;
  (in_RDI->hi).pos._M_elems[2] = -1.79769313486232e+308;
  return in_RDI;
}

Assistant:

Extent<T> intersection(Extent<T>& e1, const Extent<T>& e2) {
            if(not e1.contains(e2))
                return createEmptyBuildableExtent<T>();
            Extent<T> e;
            for(int i = 0; i < 3; i++)
                e.lo[i] = (e1.lo[i] < e2.lo[i])?(e2.lo[i]):(e1.lo[i]);

            for(int i = 0; i < 3; i++)
                e.hi[i] = (e1.hi[i] > e2.hi[i])?(e2.hi[i]):(e1.hi[i]);
            return e;
        }